

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O3

char * stripctrl_string_ptrlen(StripCtrlChars *sccpub,ptrlen str)

{
  strbuf *buf_o;
  char *pcVar1;
  
  buf_o = strbuf_new();
  sccpub[-1].binarysink_[0].binarysink_ = buf_o->binarysink_;
  *(undefined8 *)((long)&sccpub[-2].binarysink_[0].write + 4) = 0;
  *(undefined4 *)((long)&sccpub[-2].binarysink_[0].writefmtv + 4) = 0;
  sccpub[-7].binarysink_[0].binarysink_ = (BinarySink *)0x0;
  sccpub[-6].binarysink_[0].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
  *(undefined1 *)((long)&sccpub[-1].binarysink_[0].write + 1) = 1;
  BinarySink_put_datapl(sccpub->binarysink_,str);
  sccpub[-1].binarysink_[0].binarysink_ = (BinarySink *)0x0;
  *(undefined8 *)((long)&sccpub[-2].binarysink_[0].write + 4) = 0;
  *(undefined4 *)((long)&sccpub[-2].binarysink_[0].writefmtv + 4) = 0;
  sccpub[-7].binarysink_[0].binarysink_ = (BinarySink *)0x0;
  sccpub[-6].binarysink_[0].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
  *(undefined1 *)((long)&sccpub[-1].binarysink_[0].write + 1) = 1;
  pcVar1 = strbuf_to_str(buf_o);
  return pcVar1;
}

Assistant:

char *stripctrl_string_ptrlen(StripCtrlChars *sccpub, ptrlen str)
{
    strbuf *out = strbuf_new();
    stripctrl_retarget(sccpub, BinarySink_UPCAST(out));
    put_datapl(sccpub, str);
    stripctrl_retarget(sccpub, NULL);
    return strbuf_to_str(out);
}